

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# univalue_write.cpp
# Opt level: O0

ssize_t __thiscall UniValue::write_abi_cxx11_(UniValue *this,int __fd,void *__buf,size_t __n)

{
  bool bVar1;
  undefined4 in_register_00000034;
  UniValue *this_00;
  char *pcVar2;
  string local_98 [32];
  string local_78 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58 [32];
  uint local_38;
  uint modIndent;
  undefined1 local_21;
  uint local_20;
  uint local_1c;
  uint indentLevel_local;
  uint prettyIndent_local;
  UniValue *this_local;
  string *s;
  
  this_00 = (UniValue *)CONCAT44(in_register_00000034,__fd);
  local_1c = (uint)__buf;
  local_20 = (uint)__n;
  local_21 = 0;
  _indentLevel_local = this_00;
  this_local = this;
  std::__cxx11::string::string((string *)this);
  std::__cxx11::string::reserve((ulong)this);
  local_38 = local_20;
  if (local_20 == 0) {
    local_38 = 1;
  }
  switch(this_00->typ) {
  case VNULL:
    std::__cxx11::string::operator+=((string *)this,"null");
    break;
  case VOBJ:
    writeObject(this_00,local_1c,local_38,(string *)this);
    break;
  case VARR:
    writeArray(this_00,local_1c,local_38,(string *)this);
    break;
  case VSTR:
    json_escape(local_98);
    std::operator+((char *)local_78,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x11f5fa);
    std::operator+(local_58,(char *)local_78);
    std::__cxx11::string::operator+=((string *)this,(string *)local_58);
    std::__cxx11::string::~string((string *)local_58);
    std::__cxx11::string::~string(local_78);
    std::__cxx11::string::~string((string *)local_98);
    break;
  case VNUM:
    std::__cxx11::string::operator+=((string *)this,(string *)&this_00->val);
    break;
  case VBOOL:
    bVar1 = std::operator==(&this_00->val,"1");
    pcVar2 = "false";
    if (bVar1) {
      pcVar2 = "true";
    }
    std::__cxx11::string::operator+=((string *)this,pcVar2);
  }
  return (ssize_t)this;
}

Assistant:

std::string UniValue::write(unsigned int prettyIndent,
                            unsigned int indentLevel) const
{
    std::string s;
    s.reserve(1024);

    unsigned int modIndent = indentLevel;
    if (modIndent == 0)
        modIndent = 1;

    switch (typ) {
    case VNULL:
        s += "null";
        break;
    case VOBJ:
        writeObject(prettyIndent, modIndent, s);
        break;
    case VARR:
        writeArray(prettyIndent, modIndent, s);
        break;
    case VSTR:
        s += "\"" + json_escape(val) + "\"";
        break;
    case VNUM:
        s += val;
        break;
    case VBOOL:
        s += (val == "1" ? "true" : "false");
        break;
    }

    return s;
}